

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *end_5;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t found [8];
  uint16_t type;
  uint8_t *local_198;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  ulong uStack_140;
  int ret;
  size_t num_certs;
  ptls_iovec_t certs [16];
  uint8_t *end;
  uint8_t *src;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  puVar2 = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x38;
  uStack_140 = 0;
  _block_size = 1;
  if (puVar2 == end) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    do {
      puVar3 = end + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
      _block_size = _block_size - 1;
      end = puVar3;
    } while (_block_size != 0);
    if (puVar2 + -(long)puVar3 < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else if (puVar3 == puVar3 + (long)end_1) {
      if (puVar3 == puVar3 + (long)end_1) {
        _block_size_1 = 3;
        if ((ulong)((long)puVar2 - (long)puVar3) < 3) {
          _capacity._4_4_ = 0x32;
        }
        else {
          end_2 = (uint8_t *)0x0;
          do {
            puVar3 = end + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end);
            _block_size_1 = _block_size_1 - 1;
            end = puVar3;
          } while (_block_size_1 != 0);
          if (puVar2 + -(long)puVar3 < end_2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            puVar3 = puVar3 + (long)end_2;
            src = (uint8_t *)tls;
            do {
              _block_size_2 = 3;
              if ((ulong)((long)puVar3 - (long)end) < 3) {
                return 0x32;
              }
              end_3 = (uint8_t *)0x0;
              do {
                puVar4 = end + 1;
                end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end);
                _block_size_2 = _block_size_2 - 1;
                end = puVar4;
              } while (_block_size_2 != 0);
              if (puVar3 + -(long)puVar4 < end_3) {
                return 0x32;
              }
              if (uStack_140 < 0x10) {
                join_0x00000010_0x00000000_ =
                     ptls_iovec_init(puVar4,(long)(puVar4 + (long)end_3) - (long)puVar4);
                certs[uStack_140 - 1].len = (size_t)stack0xfffffffffffffe60;
                certs[uStack_140].base = local_198;
                uStack_140 = uStack_140 + 1;
              }
              end = puVar4 + (long)end_3;
              memset((void *)((long)&_capacity_3 + 6),0,8);
              _block_size_3 = 2;
              if ((ulong)((long)puVar3 - (long)end) < 2) {
                return 0x32;
              }
              end_4 = (uint8_t *)0x0;
              do {
                puVar4 = end + 1;
                end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end);
                _block_size_3 = _block_size_3 - 1;
                end = puVar4;
              } while (_block_size_3 != 0);
              if (puVar3 + -(long)puVar4 < end_4) {
                return 0x32;
              }
              puVar4 = puVar4 + (long)end_4;
              while (end != puVar4) {
                iVar1 = decode16((uint16_t *)found,&end,puVar4);
                if (iVar1 != 0) {
                  return iVar1;
                }
                if ((ushort)found._0_2_ < 8) {
                  if (((uint)*(byte *)((long)&_capacity_3 + (long)(int)((ushort)found._0_2_ / 8) + 6
                                      ) & 1 << (sbyte)((ulong)(ushort)found._0_2_ % 8)) != 0) {
                    return 0x2f;
                  }
                  *(byte *)((long)&_capacity_3 + (long)(int)((ushort)found._0_2_ / 8) + 6) =
                       *(byte *)((long)&_capacity_3 + (long)(int)((ushort)found._0_2_ / 8) + 6) |
                       (byte)(1 << ((byte)found._0_2_ & 0x1f)) & 7;
                }
                _block_size_4 = 2;
                if ((ulong)((long)puVar4 - (long)end) < 2) {
                  return 0x32;
                }
                end_5 = (uint8_t *)0x0;
                do {
                  puVar5 = end + 1;
                  end_5 = (uint8_t *)((long)end_5 << 8 | (ulong)*end);
                  _block_size_4 = _block_size_4 - 1;
                  end = puVar5;
                } while (_block_size_4 != 0);
                if (puVar4 + -(long)puVar5 < end_5) {
                  return 0x32;
                }
                end = puVar5 + (long)end_5;
              }
              if (end != puVar4) {
                return 0x32;
              }
            } while (end != puVar3);
            if (end == puVar3) {
              if (end == puVar2) {
                if ((*(long *)(*(long *)src + 0x20) == 0) ||
                   (_capacity._4_4_ =
                         (*(code *)**(undefined8 **)(*(long *)src + 0x20))
                                   (*(undefined8 *)(*(long *)src + 0x20),src,src + 0x108,src + 0x110
                                    ,&num_certs,uStack_140), _capacity._4_4_ == 0)) {
                  key_schedule_update_hash
                            (*(st_ptls_key_schedule_t **)(src + 0x50),(uint8_t *)tls_local,
                             (size_t)message_local.base);
                  src[8] = '\x05';
                  src[9] = '\0';
                  src[10] = '\0';
                  src[0xb] = '\0';
                  _capacity._4_4_ = 0x202;
                }
              }
              else {
                _capacity._4_4_ = 0x32;
              }
            }
            else {
              _capacity._4_4_ = 0x32;
            }
          }
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
    else {
      _capacity._4_4_ = 0x2f;
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *end = message.base + message.len;
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret;

    /* certificate request context */
    decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    decode_block(src, end, 3, {
        do {
            decode_open_block(src, end, 3, {
                if (num_certs < sizeof(certs) / sizeof(certs[0]))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, &type, { src = end; });
        } while (src != end);
    });

    if (tls->ctx->verify_certificate != NULL) {
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, &tls->client.certificate_verify.cb,
                                                    &tls->client.certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;

Exit:
    return ret;
}